

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian.c
# Opt level: O1

void writeUint64InLittleEndian(void *memory,uint64_t value)

{
  *(uint64_t *)memory = value;
  return;
}

Assistant:

void writeUint64InLittleEndian(void* memory, uint64_t value)
{
	uint8_t* p = memory;
	p[7] = (uint8_t)(value >> 56);
	p[6] = (uint8_t)(value >> 48);
	p[5] = (uint8_t)(value >> 40);
	p[4] = (uint8_t)(value >> 32);
	p[3] = (uint8_t)(value >> 24);
	p[2] = (uint8_t)(value >> 16);
	p[1] = (uint8_t)(value >> 8);
	p[0] = (uint8_t)(value);
}